

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O2

vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_> *
__thiscall
Gudhi::Persistence_representations::Persistence_intervals::compute_persistent_betti_numbers
          (vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
           *__return_storage_ptr__,Persistence_intervals *this)

{
  pointer ppVar1;
  pointer ppVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  allocator_type local_31;
  vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_> places_where_pbs_change
  ;
  
  std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>::vector
            (&places_where_pbs_change,
             (long)(this->intervals).
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->intervals).
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_31);
  ppVar1 = (this->intervals).
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->intervals).
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4;
  lVar4 = 8;
  while (bVar6 = lVar3 != 0, lVar3 = lVar3 + -1, bVar6) {
    *(undefined8 *)
     ((long)&places_where_pbs_change.
             super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>.
             _M_impl.super__Vector_impl_data._M_start[-1].first + lVar4 * 2) =
         *(undefined8 *)((long)ppVar1 + lVar4 + -8);
    *(undefined1 *)
     ((long)places_where_pbs_change.
            super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>.
            _M_impl.super__Vector_impl_data._M_start + lVar4 * 2 + -8) = 1;
    *(undefined8 *)
     ((long)&(places_where_pbs_change.
              super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->first + lVar4 * 2) =
         *(undefined8 *)((long)&ppVar1->first + lVar4);
    (&(places_where_pbs_change.
       super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->second)[lVar4 * 2] = false;
    lVar4 = lVar4 + 0x10;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<double,bool>*,std::vector<std::pair<double,bool>,std::allocator<std::pair<double,bool>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<double,bool>const&,std::pair<double,bool>const&)>>
            ((__normal_iterator<std::pair<double,_bool>_*,_std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>_>
              )places_where_pbs_change.
               super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<double,_bool>_*,_std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>_>
              )places_where_pbs_change.
               super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_std::pair<double,_bool>_&,_const_std::pair<double,_bool>_&)>
              )0x1035db);
  std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  ::vector(__return_storage_ptr__,
           (long)places_where_pbs_change.
                 super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)places_where_pbs_change.
                 super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_31);
  lVar3 = (long)places_where_pbs_change.
                super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)places_where_pbs_change.
                super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  ppVar2 = (__return_storage_ptr__->
           super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = 8;
  lVar5 = 0;
  while (bVar6 = lVar3 != 0, lVar3 = lVar3 + -1, bVar6) {
    lVar5 = lVar5 + ((ulong)*(byte *)((long)&(places_where_pbs_change.
                                              super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->first +
                                     lVar4) - 1 | 1);
    *(undefined8 *)((long)ppVar2 + lVar4 + -8) =
         *(undefined8 *)
          ((long)places_where_pbs_change.
                 super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar4 + -8);
    *(long *)((long)&ppVar2->first + lVar4) = lVar5;
    lVar4 = lVar4 + 0x10;
  }
  std::_Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>::
  ~_Vector_base(&places_where_pbs_change.
                 super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
               );
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, size_t> > Persistence_intervals::compute_persistent_betti_numbers() const {
  std::vector<std::pair<double, bool> > places_where_pbs_change(2 * this->intervals.size());

  for (size_t i = 0; i != this->intervals.size(); ++i) {
    places_where_pbs_change[2 * i] = std::make_pair(this->intervals[i].first, true);
    places_where_pbs_change[2 * i + 1] = std::make_pair(this->intervals[i].second, false);
  }

  std::sort(places_where_pbs_change.begin(), places_where_pbs_change.end(), compare_first_element_of_pair<double>);
  size_t pbn = 0;
  std::vector<std::pair<double, size_t> > pbns(places_where_pbs_change.size());
  for (size_t i = 0; i != places_where_pbs_change.size(); ++i) {
    if (places_where_pbs_change[i].second == true) {
      ++pbn;
    } else {
      --pbn;
    }
    pbns[i] = std::make_pair(places_where_pbs_change[i].first, pbn);
  }
  return pbns;
}